

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSession::RTPSession(RTPSession *this,RTPRandom *r,RTPMemoryManager *mgr)

{
  RTPRandom *pRVar1;
  RTPMemoryManager *mgr_local;
  RTPRandom *r_local;
  RTPSession *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSession_00192ba0;
  pRVar1 = GetRandomNumberGenerator(this,r);
  this->rtprnd = pRVar1;
  RTPSessionSources::RTPSessionSources(&this->sources,this,mgr);
  RTPPacketBuilder::RTPPacketBuilder(&this->packetbuilder,this->rtprnd,mgr);
  RTCPScheduler::RTCPScheduler(&this->rtcpsched,&(this->sources).super_RTPSources,this->rtprnd);
  RTCPPacketBuilder::RTCPPacketBuilder
            (&this->rtcpbuilder,&(this->sources).super_RTPSources,&this->packetbuilder,mgr);
  RTPCollisionList::RTPCollisionList(&this->collisionlist,mgr);
  std::__cxx11::list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
  ::list(&this->byepackets);
  this->m_changeIncomingData = false;
  this->m_changeOutgoingData = false;
  this->created = false;
  RTPTimeInitializerObject::Dummy((RTPTimeInitializerObject *)&timeinit);
  return;
}

Assistant:

RTPSession::RTPSession(RTPRandom *r,RTPMemoryManager *mgr) 
	: RTPMemoryObject(mgr),rtprnd(GetRandomNumberGenerator(r)),sources(*this,mgr),packetbuilder(*rtprnd,mgr),rtcpsched(sources,*rtprnd),
	  rtcpbuilder(sources,packetbuilder,mgr),collisionlist(mgr)
{
	// We're not going to set these flags in Create, so that the constructor of a derived class
	// can already change them
	m_changeIncomingData = false;
	m_changeOutgoingData = false;

	created = false;
	timeinit.Dummy();

	//std::cout << (void *)(rtprnd) << std::endl;
}